

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateTessCoordAtReference
          (BuiltInsValidator *this,Decoration *decoration,Instruction *built_in_inst,
          Instruction *referenced_inst,Instruction *referenced_from_inst)

{
  bool bVar1;
  spv_const_context psVar2;
  DiagnosticStream *pDVar3;
  reference pEVar4;
  mapped_type *this_00;
  BuiltInsValidator *local_640;
  code *local_638;
  undefined8 local_630;
  type local_628;
  value_type local_4d8;
  uint32_t local_4b4;
  string local_4b0;
  string local_490;
  DiagnosticStream local_470;
  ExecutionModel local_294;
  iterator iStack_290;
  ExecutionModel execution_model;
  iterator __end3;
  iterator __begin3;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *__range3;
  string local_258;
  string local_238;
  DiagnosticStream local_218;
  StorageClass local_3c;
  Instruction *pIStack_38;
  StorageClass storage_class;
  Instruction *referenced_from_inst_local;
  Instruction *referenced_inst_local;
  Instruction *built_in_inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  pIStack_38 = referenced_from_inst;
  referenced_from_inst_local = referenced_inst;
  referenced_inst_local = built_in_inst;
  built_in_inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  psVar2 = ValidationState_t::context(this->_);
  bVar1 = spvIsVulkanEnv(psVar2->target_env);
  if (bVar1) {
    local_3c = GetStorageClass(pIStack_38);
    if ((local_3c != Max) && (local_3c != Input)) {
      ValidationState_t::diag(&local_218,this->_,SPV_ERROR_INVALID_DATA,pIStack_38);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_238,this->_,0x1124,(char *)0x0);
      pDVar3 = DiagnosticStream::operator<<(&local_218,&local_238);
      pDVar3 = DiagnosticStream::operator<<
                         (pDVar3,(char (*) [94])
                                 "Vulkan spec allows BuiltIn TessCoord to be only used for variables with Input storage class. "
                         );
      (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                (&local_258,this,(Decoration *)built_in_inst_local,referenced_inst_local,
                 referenced_from_inst_local,pIStack_38,Max);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_258);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [2])0x634f49);
      (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                ((string *)&__range3,this,pIStack_38);
      pDVar3 = DiagnosticStream::operator<<
                         (pDVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&__range3);
      this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      std::__cxx11::string::~string((string *)&__range3);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_238);
      DiagnosticStream::~DiagnosticStream(&local_218);
      return this_local._4_4_;
    }
    __end3 = std::
             set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
             ::begin(&this->execution_models_);
    iStack_290 = std::
                 set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                 ::end(&this->execution_models_);
    while (bVar1 = std::operator!=(&__end3,&stack0xfffffffffffffd70), bVar1) {
      pEVar4 = std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator*(&__end3);
      local_294 = *pEVar4;
      if (local_294 != TessellationEvaluation) {
        ValidationState_t::diag(&local_470,this->_,SPV_ERROR_INVALID_DATA,pIStack_38);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_490,this->_,0x1123,(char *)0x0);
        pDVar3 = DiagnosticStream::operator<<(&local_470,&local_490);
        pDVar3 = DiagnosticStream::operator<<
                           (pDVar3,(char (*) [99])
                                   "Vulkan spec allows BuiltIn TessCoord to be used only with TessellationEvaluation execution model. "
                           );
        (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                  (&local_4b0,this,(Decoration *)built_in_inst_local,referenced_inst_local,
                   referenced_from_inst_local,pIStack_38,local_294);
        pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_4b0);
        this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::__cxx11::string::~string((string *)&local_490);
        DiagnosticStream::~DiagnosticStream(&local_470);
        return this_local._4_4_;
      }
      std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator++(&__end3);
    }
  }
  if (this->function_id_ == 0) {
    local_4b4 = Instruction::id(pIStack_38);
    this_00 = std::
              map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
              ::operator[](&this->id_to_at_reference_checks_,&local_4b4);
    local_638 = ValidateTessCoordAtReference;
    local_630 = 0;
    local_640 = this;
    std::
    bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
              (&local_628,(offset_in_BuiltInsValidator_to_subr *)&local_638,&local_640,
               (Decoration *)built_in_inst_local,referenced_inst_local,pIStack_38,
               (_Placeholder<1> *)&std::placeholders::_1);
    std::function<spv_result_t(spvtools::val::Instruction_const&)>::
    function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
              ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_4d8,&local_628);
    std::__cxx11::
    list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
    ::push_back(this_00,&local_4d8);
    std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_4d8);
    std::
    _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
    ::~_Bind(&local_628);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateTessCoordAtReference(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::StorageClass storage_class = GetStorageClass(referenced_from_inst);
    if (storage_class != spv::StorageClass::Max &&
        storage_class != spv::StorageClass::Input) {
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << _.VkErrorID(4388)
             << "Vulkan spec allows BuiltIn TessCoord to be only used for "
                "variables with Input storage class. "
             << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                 referenced_from_inst)
             << " " << GetStorageClassDesc(referenced_from_inst);
    }

    for (const spv::ExecutionModel execution_model : execution_models_) {
      if (execution_model != spv::ExecutionModel::TessellationEvaluation) {
        return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
               << _.VkErrorID(4387)
               << "Vulkan spec allows BuiltIn TessCoord to be used only with "
                  "TessellationEvaluation execution model. "
               << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                   referenced_from_inst, execution_model);
      }
    }
  }

  if (function_id_ == 0) {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
        &BuiltInsValidator::ValidateTessCoordAtReference, this, decoration,
        built_in_inst, referenced_from_inst, std::placeholders::_1));
  }

  return SPV_SUCCESS;
}